

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_color_mode_copy(LodePNGColorMode *dest,LodePNGColorMode *source)

{
  uchar *puVar1;
  LodePNGColorMode *source_local;
  LodePNGColorMode *dest_local;
  
  lodepng_color_mode_cleanup(dest);
  lodepng_memcpy(dest,source,0x28);
  if (source->palette != (uchar *)0x0) {
    puVar1 = (uchar *)lodepng_malloc(0x400);
    dest->palette = puVar1;
    if ((dest->palette == (uchar *)0x0) && (source->palettesize != 0)) {
      return 0x53;
    }
    lodepng_memcpy(dest->palette,source->palette,source->palettesize << 2);
  }
  return 0;
}

Assistant:

unsigned lodepng_color_mode_copy(LodePNGColorMode* dest, const LodePNGColorMode* source) {
  lodepng_color_mode_cleanup(dest);
  lodepng_memcpy(dest, source, sizeof(LodePNGColorMode));
  if(source->palette) {
    dest->palette = (unsigned char*)lodepng_malloc(1024);
    if(!dest->palette && source->palettesize) return 83; /*alloc fail*/
    lodepng_memcpy(dest->palette, source->palette, source->palettesize * 4);
  }
  return 0;
}